

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Employee.cpp
# Opt level: O2

ostream * operator<<(ostream *strm,Employee *obj)

{
  ostream *poVar1;
  
  poVar1 = operator<<((ostream *)&std::cout,&obj->super_Person);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(strm,"hourWork: ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,obj->hourWork);
  poVar1 = std::operator<<(poVar1,"\nsalaryPerHour: ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,obj->salaryPerHour);
  poVar1 = std::operator<<(poVar1,"\nworkToDo: ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,obj->workToDo);
  poVar1 = std::operator<<(poVar1,"\nworkDone: ");
  std::ostream::operator<<((ostream *)poVar1,obj->workDone);
  return strm;
}

Assistant:

ostream &operator<<(ostream &strm, const Employee &obj) {
    cout << static_cast<const Person &>(obj) << endl;
    strm << "hourWork: " << obj.hourWork << "\nsalaryPerHour: " << obj.salaryPerHour << "\nworkToDo: " <<
         obj.workToDo << "\nworkDone: " << obj.workDone;
    return strm;
}